

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

void __thiscall iDynTree::InverseKinematics::~InverseKinematics(InverseKinematics *this)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return;
}

Assistant:

InverseKinematics::~InverseKinematics()
    {
#ifdef IDYNTREE_USES_IPOPT
        if (m_pimpl) {
            delete IK_PIMPL(m_pimpl);
            m_pimpl = 0;
        }
#else
        missingIpoptErrorReport();
#endif
    }